

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_suffix(char *s,char *t)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = strlen(s);
  sVar4 = strlen(t);
  uVar1 = 0;
  if (sVar4 <= sVar3) {
    iVar2 = strcmp(s + (sVar3 - sVar4),t);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int stb_suffix(char *s, char *t)
{
   size_t n = strlen(s);
   size_t m = strlen(t);
   if (m <= n)
      return 0 == strcmp(s+n-m, t);
   else
      return 0;
}